

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  Rep *pRVar2;
  void *pvVar3;
  LogMessage *other;
  long lVar4;
  LogFinisher local_41;
  LogMessage local_40;
  
  iVar1 = this->current_size_;
  if ((long)iVar1 < 0) {
    LogMessage::LogMessage
              (&local_40,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x60a);
    other = LogMessage::operator<<(&local_40,"CHECK failed: (n) >= (0): ");
    LogFinisher::operator=(&local_41,other);
    LogMessage::~LogMessage(&local_40);
  }
  else if (iVar1 != 0) {
    pRVar2 = this->rep_;
    lVar4 = 0;
    do {
      pvVar3 = pRVar2->elements[lVar4];
      lVar4 = lVar4 + 1;
      *(undefined4 *)((long)pvVar3 + 0x10) = 0;
      *(undefined4 *)((long)pvVar3 + 0x24) = 0;
    } while (iVar1 != lVar4);
    this->current_size_ = 0;
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::Clear() {
  const int n = current_size_;
  GOOGLE_DCHECK_GE(n, 0);
  if (n > 0) {
    void* const* elements = rep_->elements;
    int i = 0;
    do {
      TypeHandler::Clear(cast<TypeHandler>(elements[i++]));
    } while (i < n);
    current_size_ = 0;
  }
}